

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O2

void duckdb::TemplatedConstructSortKey<duckdb::SortKeyConstantOperator<bool>>
               (SortKeyVectorData *vector_data,SortKeyChunk chunk,SortKeyConstructInfo *info)

{
  data_t dVar1;
  data_ptr_t pdVar2;
  unsafe_vector<idx_t> *puVar3;
  sel_t *psVar4;
  pointer puVar5;
  data_ptr_t pdVar6;
  unsigned_long uVar7;
  bool bVar8;
  ulong uVar9;
  idx_t b;
  ulong uVar10;
  idx_t iVar11;
  ulong uVar12;
  
  pdVar2 = (vector_data->format).data;
  puVar3 = info->offsets;
  for (iVar11 = chunk.start; iVar11 < chunk.end; iVar11 = iVar11 + 1) {
    uVar12 = iVar11;
    if (((undefined1  [32])chunk & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
      uVar12 = chunk.result_index;
    }
    psVar4 = ((vector_data->format).sel)->sel_vector;
    uVar9 = iVar11;
    if (psVar4 != (sel_t *)0x0) {
      uVar9 = (ulong)psVar4[iVar11];
    }
    puVar5 = (puVar3->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = info->result_data[uVar12];
    bVar8 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(vector_data->format).validity.super_TemplatedValidityMask<unsigned_long>,
                       uVar9);
    uVar7 = puVar5[uVar12];
    if (bVar8) {
      dVar1 = vector_data->valid_byte;
      puVar5[uVar12] = uVar7 + 1;
      pdVar6[uVar7] = dVar1;
      pdVar6[puVar5[uVar12]] = pdVar2[uVar9];
      uVar9 = puVar5[uVar12];
      uVar10 = uVar9;
      if (info->flip_bytes == true) {
        for (; uVar9 = uVar9 + 1, uVar10 < uVar9; uVar10 = uVar10 + 1) {
          pdVar6[uVar10] = ~pdVar6[uVar10];
          uVar9 = puVar5[uVar12];
        }
      }
      else {
        uVar9 = uVar9 + 1;
      }
      puVar5[uVar12] = uVar9;
    }
    else {
      dVar1 = vector_data->null_byte;
      puVar5[uVar12] = uVar7 + 1;
      pdVar6[uVar7] = dVar1;
    }
  }
  return;
}

Assistant:

void TemplatedConstructSortKey(SortKeyVectorData &vector_data, SortKeyChunk chunk, SortKeyConstructInfo &info) {
	auto data = UnifiedVectorFormat::GetData<typename OP::TYPE>(vector_data.format);
	auto &offsets = info.offsets;
	for (idx_t r = chunk.start; r < chunk.end; r++) {
		auto result_index = chunk.GetResultIndex(r);
		auto idx = vector_data.format.sel->get_index(r);
		auto &offset = offsets[result_index];
		auto result_ptr = info.result_data[result_index];
		if (!vector_data.format.validity.RowIsValid(idx)) {
			// NULL value - write the null byte and skip
			result_ptr[offset++] = vector_data.null_byte;
			continue;
		}
		// valid value - write the validity byte
		result_ptr[offset++] = vector_data.valid_byte;
		idx_t encode_len = OP::Encode(result_ptr + offset, data[idx]);
		if (info.flip_bytes) {
			// descending order - so flip bytes
			for (idx_t b = offset; b < offset + encode_len; b++) {
				result_ptr[b] = ~result_ptr[b];
			}
		}
		offset += encode_len;
	}
}